

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::SingularVarBigint<int,unsigned_char,true>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  char cVar1;
  uint *puVar2;
  char *pcVar3;
  ParseContext *ctx_00;
  uint uVar4;
  ulong uVar5;
  ushort *puVar6;
  
  if (-1 < *ptr) {
    protobuf_assumption_failed
              ("static_cast<int8_t>(*ptr) < 0",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
               ,0x39f);
  }
  uVar5 = (long)ptr[1] << 7 | 0x7f;
  if ((long)uVar5 < 0) {
    ctx_00 = (ParseContext *)((long)ptr[2] << 0xe | 0x3fff);
    if ((long)ctx_00 < 0) {
      uVar5 = uVar5 & ((long)ptr[3] << 0x15 | 0x1fffffU);
      if ((long)uVar5 < 0) {
        ctx_00 = (ParseContext *)((ulong)ctx_00 & ((long)ptr[4] << 0x1c | 0xfffffffU));
        if ((long)ctx_00 < 0) {
          uVar5 = uVar5 & ((long)ptr[5] << 0x23 | 0x7ffffffffU);
          if ((long)uVar5 < 0) {
            ctx_00 = (ParseContext *)((ulong)ctx_00 & ((long)ptr[6] << 0x2a | 0x3ffffffffffU));
            if ((long)ctx_00 < 0) {
              uVar5 = uVar5 & ((long)ptr[7] << 0x31 | 0x1ffffffffffffU);
              if ((long)uVar5 < 0) {
                ctx_00 = (ParseContext *)
                         ((ulong)ctx_00 & ((ulong)(byte)ptr[8] << 0x38 | 0xffffffffffffff));
                if ((long)ctx_00 < 0) {
                  cVar1 = ptr[9];
                  puVar6 = (ushort *)(ptr + 10);
                  if ((cVar1 != '\x01') && (cVar1 < '\0')) {
                    pcVar3 = Error(msg,(char *)CONCAT71(0xffffffffffffff,cVar1),ctx_00,data,table,
                                   hasbits);
                    return pcVar3;
                  }
                }
                else {
                  puVar6 = (ushort *)(ptr + 9);
                }
              }
              else {
                puVar6 = (ushort *)(ptr + 8);
              }
            }
            else {
              puVar6 = (ushort *)(ptr + 7);
            }
          }
          else {
            puVar6 = (ushort *)(ptr + 6);
          }
        }
        else {
          puVar6 = (ushort *)(ptr + 5);
        }
      }
      else {
        puVar6 = (ushort *)(ptr + 4);
      }
    }
    else {
      puVar6 = (ushort *)(ptr + 3);
    }
    uVar5 = uVar5 & (ulong)ctx_00;
  }
  else {
    puVar6 = (ushort *)(ptr + 2);
  }
  uVar4 = (uint)uVar5 & (int)*ptr;
  puVar2 = (uint *)RefAt<int>(msg,(ulong)data.field_0 >> 0x30);
  *puVar2 = -(uVar4 & 1) ^ uVar4 >> 1;
  if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar6) {
    if ((ulong)table->has_bits_offset != 0) {
      puVar2 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
      *puVar2 = *puVar2 | (uint)hasbits;
    }
    return (char *)puVar6;
  }
  uVar4 = (uint)table->fast_idx_mask & (uint)*puVar6;
  if ((uVar4 & 7) == 0) {
    uVar5 = (ulong)(uVar4 & 0xfffffff8);
    pcVar3 = (char *)(**(code **)(&table[1].has_bits_offset + uVar5))
                               (msg,puVar6,ctx,
                                (ulong)*puVar6 ^ *(ulong *)(&table[1].fast_idx_mask + uVar5 * 2),
                                table,hasbits);
    return pcVar3;
  }
  protobuf_assumption_failed
            ("(idx & 7) == 0",
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
             ,0x452);
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::SingularVarBigint(
    PROTOBUF_TC_PARAM_DECL) {
  uint64_t tmp;
  PROTOBUF_ASSUME(static_cast<int8_t>(*ptr) < 0);
  ptr = ParseVarint(ptr, &tmp);

  if (ABSL_PREDICT_FALSE(ptr == nullptr)) {
    PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
  }
  RefAt<FieldType>(msg, data.offset()) =
      ZigZagDecodeHelper<FieldType, zigzag>(tmp);
  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}